

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::write_int_data<char>::write_int_data
          (write_int_data<char> *this,int num_digits,string_view prefix,
          basic_format_specs<char> *specs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (-1 < num_digits) {
    uVar2 = (ulong)(uint)num_digits + prefix.size_;
    this->size = uVar2;
    this->padding = 0;
    if ((specs->field_0x9 & 0xf) == 4) {
      uVar3 = (ulong)specs->width;
      if (-1 < (long)uVar3) {
        if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
          this->padding = uVar3 - uVar2;
          this->size = uVar3;
        }
        return;
      }
    }
    else {
      uVar1 = specs->precision;
      if ((int)uVar1 <= num_digits) {
        return;
      }
      if (-1 < (int)uVar1) {
        this->size = prefix.size_ + (ulong)uVar1;
        if (-1 < (int)(uVar1 - num_digits)) {
          this->padding = (ulong)(uVar1 - num_digits);
          return;
        }
      }
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/core.h"
              ,0x13d,"negative value");
}

Assistant:

write_int_data(int num_digits, string_view prefix,
                 const basic_format_specs<Char>& specs)
      : size(prefix.size() + to_unsigned(num_digits)), padding(0) {
    if (specs.align == align::numeric) {
      auto width = to_unsigned(specs.width);
      if (width > size) {
        padding = width - size;
        size = width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
    }
  }